

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

long xmlGetLineNoInternal(xmlNode *node,int depth)

{
  ushort uVar1;
  xmlElementType xVar2;
  void *pvVar3;
  _xmlNode *p_Var4;
  
  while( true ) {
    if (node == (xmlNode *)0x0) {
      return -1;
    }
    if (4 < depth) {
      return -1;
    }
    xVar2 = node->type;
    if ((xVar2 < XML_DOCUMENT_NODE) &&
       ((0x18aU >> (xVar2 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) break;
    p_Var4 = node->prev;
    if (((p_Var4 == (_xmlNode *)0x0) || (XML_COMMENT_NODE < p_Var4->type)) ||
       ((0x18aU >> (p_Var4->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0)) {
      node = node->parent;
      if (node == (_xmlNode *)0x0) {
        return -1;
      }
      if (node->type != XML_ELEMENT_NODE) {
        return -1;
      }
      depth = depth + 1;
    }
    else {
      depth = depth + 1;
      node = p_Var4;
    }
  }
  uVar1 = node->line;
  pvVar3 = (void *)0xffffffffffffffff;
  if ((void *)(ulong)uVar1 != (void *)0xffff) goto LAB_00185f9e;
  if (xVar2 == XML_ELEMENT_NODE) {
    p_Var4 = node->children;
    if (p_Var4 == (_xmlNode *)0x0) goto LAB_00185f8b;
  }
  else {
    if ((xVar2 == XML_TEXT_NODE) && (pvVar3 = node->psvi, pvVar3 != (void *)0x0)) goto LAB_00185f9e;
LAB_00185f8b:
    p_Var4 = node->next;
    if ((p_Var4 == (_xmlNode *)0x0) &&
       (p_Var4 = node->prev, pvVar3 = (void *)0xffffffffffffffff, p_Var4 == (_xmlNode *)0x0))
    goto LAB_00185f9e;
  }
  pvVar3 = (void *)xmlGetLineNoInternal(p_Var4,depth + 1);
LAB_00185f9e:
  if ((pvVar3 == (void *)0xffff) || (pvVar3 == (void *)0xffffffffffffffff)) {
    pvVar3 = (void *)(ulong)uVar1;
  }
  return (long)pvVar3;
}

Assistant:

static long
xmlGetLineNoInternal(const xmlNode *node, int depth)
{
    long result = -1;

    if (depth >= 5)
        return(-1);

    if (!node)
        return result;
    if ((node->type == XML_ELEMENT_NODE) ||
        (node->type == XML_TEXT_NODE) ||
	(node->type == XML_COMMENT_NODE) ||
	(node->type == XML_PI_NODE)) {
	if (node->line == 65535) {
	    if ((node->type == XML_TEXT_NODE) && (node->psvi != NULL))
	        result = (long) (ptrdiff_t) node->psvi;
	    else if ((node->type == XML_ELEMENT_NODE) &&
	             (node->children != NULL))
	        result = xmlGetLineNoInternal(node->children, depth + 1);
	    else if (node->next != NULL)
	        result = xmlGetLineNoInternal(node->next, depth + 1);
	    else if (node->prev != NULL)
	        result = xmlGetLineNoInternal(node->prev, depth + 1);
	}
	if ((result == -1) || (result == 65535))
	    result = (long) node->line;
    } else if ((node->prev != NULL) &&
             ((node->prev->type == XML_ELEMENT_NODE) ||
	      (node->prev->type == XML_TEXT_NODE) ||
	      (node->prev->type == XML_COMMENT_NODE) ||
	      (node->prev->type == XML_PI_NODE)))
        result = xmlGetLineNoInternal(node->prev, depth + 1);
    else if ((node->parent != NULL) &&
             (node->parent->type == XML_ELEMENT_NODE))
        result = xmlGetLineNoInternal(node->parent, depth + 1);

    return result;
}